

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O3

void __thiscall
JITTimeWorkItem::InitializeReader
          (JITTimeWorkItem *this,ByteCodeReader *reader,
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          *statementReader,ArenaAllocator *alloc)

{
  JITTimeFunctionBody *pJVar1;
  Type TVar2;
  int iVar3;
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  JITLoopHeaderIDL *pJVar8;
  CodeGenWorkItemIDL *pCVar9;
  ArenaStatementMapList *pAVar10;
  StatementMapIDL *pSVar11;
  byte *pbVar12;
  FunctionProxy *this_01;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  undefined4 *puVar13;
  Type *pTVar14;
  Type *ppSVar15;
  ulong uVar16;
  uint index;
  SmallSpanSequence *statementMap;
  uint local_34;
  
  pCVar9 = this->m_workItemData;
  local_34 = 0;
  if (pCVar9->type == '\x01') {
    uVar6 = GetLoopNumber(this);
    pJVar8 = JITTimeFunctionBody::GetLoopHeaderData(&this->m_jitBody,uVar6);
    local_34 = pJVar8->startOffset;
    pCVar9 = this->m_workItemData;
  }
  if (pCVar9->isJitInDebugMode != '\0') {
    pAVar10 = (ArenaStatementMapList *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
    (pAVar10->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = alloc;
    (pAVar10->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d5858;
    (pAVar10->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pAVar10->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    pAVar10->length = 0;
    pAVar10->increment = 4;
    this->m_fullStatementList = pAVar10;
    pJVar1 = &this->m_jitBody;
    pSVar11 = JITTimeFunctionBody::GetFullStatementMap(pJVar1);
    uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    if (uVar6 != 0) {
      uVar16 = 0;
      do {
        this_00 = this->m_fullStatementList;
        JsUtil::
        List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this_00,0);
        iVar3 = (this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (this_00->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar3] = (StatementMap *)pSVar11;
        (this_00->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar3 + 1;
        uVar16 = uVar16 + 1;
        uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
        pSVar11 = pSVar11 + 1;
      } while (uVar16 < uVar6);
    }
  }
  pJVar1 = &this->m_jitBody;
  pbVar12 = JITTimeFunctionBody::GetByteCodeBuffer(pJVar1);
  uVar6 = JITTimeFunctionBody::GetByteCodeLength(pJVar1);
  Js::ByteCodeReader::Create(reader,pbVar12,local_34,uVar6);
  this_01 = (FunctionProxy *)JITTimeFunctionBody::GetAddr(pJVar1);
  this_02 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)Js::FunctionProxy::GetAuxPtrWithLock(this_01,StatementMaps);
  if (this->m_fullStatementList != (ArenaStatementMapList *)0x0) {
    uVar7 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    uVar6 = (this_02->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    if (uVar7 != uVar6 || (int)uVar6 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,100,
                         "(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0))"
                         ,
                         "!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0)"
                        );
      if (!bVar5) {
LAB_0056d3a8:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar13 = 0;
    }
  }
  uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
  if (uVar6 != 0) {
    index = 0;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pTVar14 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar14->ptr->byteCodeSpan).begin;
      ppSVar15 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar15)->byteCodeSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x67,
                           "(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin"
                          );
        if (!bVar5) goto LAB_0056d3a8;
        *puVar13 = 0;
      }
      pTVar14 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar14->ptr->byteCodeSpan).end;
      ppSVar15 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar15)->byteCodeSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x68,
                           "(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end"
                          );
        if (!bVar5) goto LAB_0056d3a8;
        *puVar13 = 0;
      }
      pTVar14 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar14->ptr->sourceSpan).begin;
      ppSVar15 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar15)->sourceSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x69,
                           "(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin"
                          );
        if (!bVar5) goto LAB_0056d3a8;
        *puVar13 = 0;
      }
      pTVar14 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar14->ptr->sourceSpan).end;
      ppSVar15 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar15)->sourceSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6a,
                           "(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end"
                          );
        if (!bVar5) goto LAB_0056d3a8;
        *puVar13 = 0;
      }
      pTVar14 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      TVar2 = pTVar14->ptr->isSubexpression;
      ppSVar15 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (TVar2 != (*ppSVar15)->isSubexpression) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6b,
                           "(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression)"
                           ,
                           "runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression"
                          );
        if (!bVar5) goto LAB_0056d3a8;
        *puVar13 = 0;
      }
      index = index + 1;
      uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    } while (index < uVar6);
  }
  bVar5 = JITTimeFunctionBody::InitializeStatementMap(pJVar1,&this->m_statementMap,alloc);
  if (statementReader !=
      (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
       *)0x0) {
    statementMap = (SmallSpanSequence *)0x0;
    if (bVar5) {
      statementMap = &this->m_statementMap;
    }
    pbVar12 = JITTimeFunctionBody::GetByteCodeBuffer(pJVar1);
    Js::
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::Create(statementReader,pbVar12,local_34,statementMap,this->m_fullStatementList);
    return;
  }
  return;
}

Assistant:

void
JITTimeWorkItem::InitializeReader(
    Js::ByteCodeReader * reader,
    Js::StatementReader<Js::FunctionBody::ArenaStatementMapList> * statementReader, ArenaAllocator* alloc)
{
    uint startOffset = IsLoopBody() ? GetLoopHeader()->startOffset : 0;

    if (IsJitInDebugMode())
    {
        // TODO: OOP JIT, directly use the array rather than making a list
        m_fullStatementList = Js::FunctionBody::ArenaStatementMapList::New(alloc);
        CompileAssert(sizeof(StatementMapIDL) == sizeof(Js::FunctionBody::StatementMap));

        StatementMapIDL * fullArr = m_jitBody.GetFullStatementMap();
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            m_fullStatementList->Add((Js::FunctionBody::StatementMap*)&fullArr[i]);
        }
    }
#if DBG
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, m_jitBody.GetByteCodeLength());
    if (!JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        Js::FunctionBody::StatementMapList * runtimeMap = ((Js::FunctionBody*)m_jitBody.GetAddr())->GetStatementMaps();
        Assert(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0));
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            Assert(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin);
            Assert(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end);
            Assert(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin);
            Assert(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end);
            Assert(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression);
        }
    }
#else
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset);
#endif
    bool hasSpanSequenceMap = m_jitBody.InitializeStatementMap(&m_statementMap, alloc);
    Js::SmallSpanSequence * spanSeq = hasSpanSequenceMap ? &m_statementMap : nullptr;
    if (statementReader)
    {
        statementReader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, spanSeq, m_fullStatementList);
    }
}